

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::undoLast(Plan *this)

{
  size_type sVar1;
  long in_RDI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  Station *in_stack_000000e8;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_ffffffffffffffd0;
  Station *in_stack_ffffffffffffffd8;
  Plan *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x58) != 0) {
    Station::undoLast_abi_cxx11_(in_stack_000000e8);
    sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            size(in_stack_ffffffffffffffd0);
    if (sVar1 != 0) {
      incremental_eval(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
                      );
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15ecf7);
  }
  return;
}

Assistant:

void Plan::undoLast() {
    if (last_changed==NULL) return;
    list< pair< int, double > > diff = last_changed->undoLast();
    if (diff.size()>0)
      incremental_eval (*last_changed, diff);
  }